

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

ly_bool lydict_val_eq(void *val1_p,void *val2_p,ly_bool UNUSED_mod,void *cb_data)

{
  size_t __n;
  int iVar1;
  char *pcVar2;
  
  if (val1_p == (void *)0x0) {
LAB_001120b1:
    pcVar2 = "val1_p";
  }
  else {
    if (val2_p != (void *)0x0) {
      if (cb_data == (void *)0x0) {
        pcVar2 = "cb_data";
        goto LAB_001120df;
      }
      if (*val1_p == (char *)0x0) goto LAB_001120b1;
      pcVar2 = *val2_p;
      if (pcVar2 != (char *)0x0) {
        __n = *cb_data;
        iVar1 = strncmp(*val1_p,pcVar2,__n);
        if ((iVar1 == 0) && (pcVar2[__n] == '\0')) {
          return '\x01';
        }
        return '\0';
      }
    }
    pcVar2 = "val2_p";
  }
LAB_001120df:
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar2,"lydict_val_eq");
  return '\0';
}

Assistant:

static ly_bool
lydict_val_eq(void *val1_p, void *val2_p, ly_bool UNUSED(mod), void *cb_data)
{
    const char *str1, *str2;
    size_t *len1;

    LY_CHECK_ARG_RET(NULL, val1_p, val2_p, cb_data, 0);

    str1 = ((struct ly_dict_rec *)val1_p)->value;
    str2 = ((struct ly_dict_rec *)val2_p)->value;
    len1 = cb_data;

    LY_CHECK_ERR_RET(!str1, LOGARG(NULL, val1_p), 0);
    LY_CHECK_ERR_RET(!str2, LOGARG(NULL, val2_p), 0);

    if (!strncmp(str1, str2, *len1) && !str2[*len1]) {
        return 1;
    }

    return 0;
}